

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-decompile.cc
# Opt level: O0

int ProgramMain(int argc,char **argv)

{
  FILE *file;
  bool bVar1;
  Enum EVar2;
  char *pcVar3;
  uchar *data;
  size_type size;
  ulong uVar4;
  void *src;
  size_t size_00;
  Callback *callback;
  ReadBinaryOptions *options_00;
  string_view filename;
  string local_778;
  string_view local_758;
  undefined1 local_748 [8];
  FileStream stream;
  string s;
  Result dummy_result;
  undefined1 local_6d3 [8];
  ValidateOptions options_1;
  undefined1 local_6b8 [8];
  ReadBinaryOptions options;
  undefined1 local_688 [7];
  bool kStopOnFirstError;
  Module module;
  Errors errors;
  basic_string_view<char,_std::char_traits<char>_> local_2a8;
  Result local_294;
  undefined1 local_290 [4];
  Result result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Callback local_270;
  allocator<char> local_249;
  string local_248;
  anon_class_8_1_de19981d local_228;
  NullCallback local_220;
  anon_class_8_1_416780aa local_200;
  Callback local_1f8;
  undefined1 local_1d8 [8];
  OptionParser parser;
  char s_description [208];
  bool local_6d;
  undefined1 local_6c [7];
  bool fail_on_custom_section_error;
  DecompileOptions decompile_options;
  Features features;
  string outfile;
  string infile;
  char **argv_local;
  int argc_local;
  
  wabt::InitStdio();
  std::__cxx11::string::string((string *)(outfile.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&features.annotations_enabled_);
  wabt::Features::Features((Features *)(local_6c + 1));
  local_6d = true;
  memcpy(&parser.on_error_._M_invoker,
         "  Read a file in the WebAssembly binary format, and convert it to\n  a decompiled text file.\n\nexamples:\n  # parse binary file test.wasm and write text file test.dcmp\n  $ wasm-decompile test.wasm -o test.dcmp\n"
         ,0xd0);
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_1d8,"wasm-decompile",(char *)&parser.on_error_._M_invoker);
  local_200.outfile = (string *)&features.annotations_enabled_;
  std::function<void(char_const*)>::function<ProgramMain(int,char**)::__0,void>
            ((function<void(char_const*)> *)&local_1f8,&local_200);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_1d8,'o',"output","FILENAME",
             "Output file for the decompiled file, by default use stdout",&local_1f8);
  std::function<void_(const_char_*)>::~function(&local_1f8);
  wabt::Features::AddOptions((Features *)(local_6c + 1),(OptionParser *)local_1d8);
  local_228.fail_on_custom_section_error = &local_6d;
  std::function<void()>::function<ProgramMain(int,char**)::__1,void>
            ((function<void()> *)&local_220,&local_228);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_1d8,"ignore-custom-section-errors",
             "Ignore errors in custom sections",&local_220);
  std::function<void_()>::~function(&local_220);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"filename",&local_249);
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(outfile.field_2._M_local_buf + 8);
  std::function<void(char_const*)>::function<ProgramMain(int,char**)::__2,void>
            ((function<void(char_const*)> *)&local_270,
             (anon_class_8_1_5a8ed95f *)
             &file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  callback = &local_270;
  wabt::OptionParser::AddArgument((OptionParser *)local_1d8,&local_248,One,callback);
  std::function<void_(const_char_*)>::~function(&local_270);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  wabt::OptionParser::Parse((OptionParser *)local_1d8,argc,argv);
  wabt::OptionParser::~OptionParser((OptionParser *)local_1d8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a8,pcVar3);
  filename._M_str = local_290;
  filename._M_len = (size_t)local_2a8._M_str;
  local_294 = wabt::ReadFile((wabt *)local_2a8._M_len,filename,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  bVar1 = wabt::Succeeded(local_294);
  if (bVar1) {
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
               &module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    wabt::Module::Module((Module *)local_688);
    options._39_1_ = 1;
    wabt::ReadBinaryOptions::ReadBinaryOptions
              ((ReadBinaryOptions *)local_6b8,(Features *)(local_6c + 1),(Stream *)0x0,true,true,
               (bool)(local_6d & 1));
    pcVar3 = (char *)std::__cxx11::string::c_str();
    data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290);
    size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290);
    options_00 = (ReadBinaryOptions *)local_6b8;
    options_1.features._11_4_ =
         wabt::ReadBinaryIr(pcVar3,data,size,options_00,
                            (Errors *)
                            &module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (Module *)local_688);
    options_1.features._15_4_ = options_1.features._11_4_;
    local_294 = (Result)options_1.features._11_4_;
    bVar1 = wabt::Succeeded((Result)options_1.features._11_4_);
    if (bVar1) {
      wabt::ValidateOptions::ValidateOptions
                ((ValidateOptions *)local_6d3,(Features *)(local_6c + 1));
      local_294 = wabt::ValidateModule
                            ((Module *)local_688,
                             (Errors *)
                             &module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count
                             ,(ValidateOptions *)local_6d3);
      bVar1 = wabt::Succeeded(local_294);
      if (bVar1) {
        local_294 = wabt::GenerateNames((Module *)local_688,AlphaNames);
      }
      bVar1 = wabt::Succeeded(local_294);
      if (bVar1) {
        wabt::RenameAll((Module *)local_688);
      }
      bVar1 = wabt::Succeeded(local_294);
      if (bVar1) {
        wabt::ApplyNames((Module *)local_688);
      }
      bVar1 = wabt::Succeeded(local_294);
      if (bVar1) {
        wabt::Decompile_abi_cxx11_
                  ((string *)&stream.should_close_,(wabt *)local_688,(Module *)local_6c,
                   (DecompileOptions *)options_00);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          local_758 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)&features.annotations_enabled_);
          wabt::FileStream::FileStream((FileStream *)local_748,local_758,(Stream *)0x0);
        }
        else {
          wabt::FileStream::FileStream((FileStream *)local_748,_stdout,(Stream *)0x0);
        }
        src = (void *)std::__cxx11::string::data();
        size_00 = std::__cxx11::string::size();
        wabt::Stream::WriteData((Stream *)local_748,src,size_00,(char *)0x0,No);
        wabt::FileStream::~FileStream((FileStream *)local_748);
        std::__cxx11::string::~string((string *)&stream.should_close_);
      }
    }
    file = _stderr;
    std::__cxx11::string::string((string *)&local_778);
    wabt::FormatErrorsToFile
              ((Errors *)&module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count,
               Binary,(LexerSourceLineFinder *)0x0,file,&local_778,Never,0x50);
    std::__cxx11::string::~string((string *)&local_778);
    wabt::Module::~Module((Module *)local_688);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
               &module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  EVar2 = wabt::Result::operator_cast_to_Enum(&local_294);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290);
  std::__cxx11::string::~string((string *)&features.annotations_enabled_);
  std::__cxx11::string::~string((string *)(outfile.field_2._M_local_buf + 8));
  return (uint)(EVar2 != Ok);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  std::string infile;
  std::string outfile;
  Features features;
  DecompileOptions decompile_options;
  bool fail_on_custom_section_error = true;

  {
    const char s_description[] =
        "  Read a file in the WebAssembly binary format, and convert it to\n"
        "  a decompiled text file.\n"
        "\n"
        "examples:\n"
        "  # parse binary file test.wasm and write text file test.dcmp\n"
        "  $ wasm-decompile test.wasm -o test.dcmp\n";
    OptionParser parser("wasm-decompile", s_description);
    parser.AddOption(
        'o', "output", "FILENAME",
        "Output file for the decompiled file, by default use stdout",
        [&](const char* argument) {
          outfile = argument;
          ConvertBackslashToSlash(&outfile);
        });
    features.AddOptions(&parser);
    parser.AddOption("ignore-custom-section-errors",
                     "Ignore errors in custom sections",
                     [&]() { fail_on_custom_section_error = false; });
    parser.AddArgument("filename", OptionParser::ArgumentCount::One,
                       [&](const char* argument) {
                         infile = argument;
                         ConvertBackslashToSlash(&infile);
                       });
    parser.Parse(argc, argv);
  }

  std::vector<uint8_t> file_data;
  Result result = ReadFile(infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    ReadBinaryOptions options(features, nullptr, true, kStopOnFirstError,
                              fail_on_custom_section_error);
    result = ReadBinaryIr(infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      ValidateOptions options(features);
      result = ValidateModule(&module, &errors, options);
      if (Succeeded(result)) {
        result =
            GenerateNames(&module, static_cast<NameOpts>(NameOpts::AlphaNames));
      }
      if (Succeeded(result)) {
        // Must be called after ReadBinaryIr & GenerateNames, and before
        // ApplyNames, see comments at definition.
        RenameAll(module);
      }
      if (Succeeded(result)) {
        /* TODO(binji): This shouldn't fail; if a name can't be applied
         * (because the index is invalid, say) it should just be skipped. */
        Result dummy_result = ApplyNames(&module);
        WABT_USE(dummy_result);
      }
      if (Succeeded(result)) {
        auto s = Decompile(module, decompile_options);
        FileStream stream(!outfile.empty() ? FileStream(outfile)
                                           : FileStream(stdout));
        stream.WriteData(s.data(), s.size());
      }
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}